

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.hpp
# Opt level: O0

bool vk::ValidateQueryBits::
     checkBits<__gnu_cxx::__normal_iterator<vk::VkSurfaceFormatKHR*,std::vector<vk::VkSurfaceFormatKHR,std::allocator<vk::VkSurfaceFormatKHR>>>>
               (__normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
                beg,__normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
                    end,deUint8 pattern)

{
  bool bVar1;
  reference pVVar2;
  ulong local_38;
  size_t i;
  deUint8 *elementBytes;
  __normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  _Stack_20;
  deUint8 pattern_local;
  __normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  end_local;
  __normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
  beg_local;
  
  _Stack_20._M_current = end._M_current;
  end_local._M_current = beg._M_current;
  do {
    bVar1 = __gnu_cxx::operator<(&end_local,&stack0xffffffffffffffe0);
    if (!bVar1) {
      return true;
    }
    pVVar2 = __gnu_cxx::
             __normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
             ::operator*(&end_local);
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      if (*(deUint8 *)((long)&pVVar2->format + local_38) != pattern) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<vk::VkSurfaceFormatKHR_*,_std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>_>
    ::operator++(&end_local);
  } while( true );
}

Assistant:

bool checkBits (IterT beg, const IterT end, const deUint8 pattern = 0xdeu)
{
	for (; beg < end; ++beg)
	{
		const deUint8* elementBytes = reinterpret_cast<const deUint8*>(&(*beg));
		for (std::size_t i = 0u; i < sizeof(*beg); ++i)
		{
			if (elementBytes[i] != pattern)
				return false;
		}
	}
	return true;
}